

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O2

void __thiscall iDynTree::KinDynComputations::computeFwdKinematics(KinDynComputations *this)

{
  KinDynComputationsPrivateAttributes *pKVar1;
  bool bVar2;
  
  pKVar1 = this->pimpl;
  if (pKVar1->m_isFwdKinematicsUpdated == false) {
    bVar2 = (bool)iDynTree::ForwardPosVelKinematics
                            (&pKVar1->m_robot_model,&pKVar1->m_traversal,&pKVar1->m_pos,
                             &pKVar1->m_vel,&pKVar1->m_linkPos,&pKVar1->m_linkVel);
    this->pimpl->m_isFwdKinematicsUpdated = bVar2;
  }
  return;
}

Assistant:

void KinDynComputations::computeFwdKinematics()
{
    if( this->pimpl->m_isFwdKinematicsUpdated )
    {
        return;
    }

    // Compute position and velocity kinematics
    bool ok = ForwardPosVelKinematics(this->pimpl->m_robot_model,
                                      this->pimpl->m_traversal,
                                      this->pimpl->m_pos,
                                      this->pimpl->m_vel,
                                      this->pimpl->m_linkPos,
                                      this->pimpl->m_linkVel);

    this->pimpl->m_isFwdKinematicsUpdated = ok;
}